

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_bench.cc
# Opt level: O2

void verify_equal(char *input,size_t size,string *output)

{
  int iVar1;
  pointer __s1;
  
  if (output->_M_string_length == 0) {
    __s1 = (pointer)0x0;
  }
  else {
    __s1 = (output->_M_dataplus)._M_p;
  }
  if (output->_M_string_length == size) {
    iVar1 = bcmp(__s1,input,size);
    if (iVar1 == 0) {
      return;
    }
  }
  fwrite("uncompressed data does not match the input data\n",0x30,1,_stderr);
  exit(3);
}

Assistant:

void verify_equal(const char* input, size_t size, std::string* output) {
  const char* data = string_data(output);
  if (output->size() == size && !memcmp(data, input, size))
    return;
  fprintf(stderr, "uncompressed data does not match the input data\n");
  exit(3);
}